

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall server_context::process_single_task(server_context *this,server_task *task)

{
  int64_t iVar1;
  undefined8 uVar2;
  initializer_list_t init;
  double dVar3;
  size_t sVar4;
  uint uVar5;
  bool bVar6;
  int32_t iVar7;
  pointer psVar8;
  undefined8 uVar9;
  int *piVar10;
  size_type sVar11;
  pointer psVar12;
  common_log *pcVar13;
  pointer psVar14;
  pointer __n;
  server_response *psVar15;
  uint64_t uVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  uint *in_RSI;
  long in_RDI;
  int iVar17;
  undefined8 in_R8;
  __single_object res_4;
  __single_object res_3;
  size_t n_erased;
  server_slot *slot_5;
  int id_slot_3;
  __single_object res_2;
  double t_restore_ms;
  int64_t t_end_1;
  size_t nread;
  size_t token_count_1;
  string filepath_1;
  string filename_1;
  int64_t t_start_1;
  server_slot *slot_4;
  int id_slot_2;
  __single_object res_1;
  double t_save_ms;
  int64_t t_end;
  size_t nwrite;
  string filepath;
  string filename;
  int64_t t_start;
  size_t token_count;
  server_slot *slot_3;
  int id_slot_1;
  __single_object res;
  json slot_data;
  server_slot *slot_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<server_slot,_std::allocator<server_slot>_> *__range3_1;
  int n_processing_slots;
  int n_idle_slots;
  json slots_data;
  server_slot *slot_1;
  iterator __end3;
  iterator __begin3;
  vector<server_slot,_std::allocator<server_slot>_> *__range3;
  server_slot *slot;
  int id_slot;
  server_slot *in_stack_000005c8;
  undefined4 in_stack_fffffffffffffb28;
  error_type in_stack_fffffffffffffb2c;
  string *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  uint uVar18;
  undefined4 in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *this_00;
  server_context *in_stack_fffffffffffffb48;
  int iVar19;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  server_queue *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffb88;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffb90;
  size_t sVar20;
  server_task *in_stack_fffffffffffffba8;
  server_context *in_stack_fffffffffffffbb0;
  server_task *in_stack_fffffffffffffcb8;
  server_slot *in_stack_fffffffffffffcc0;
  server_context *in_stack_fffffffffffffcc8;
  server_slot *local_2c8;
  undefined1 local_2b0 [8];
  unique_ptr<server_task_result,_std::default_delete<server_task_result>_> local_2a8;
  undefined1 local_2a0 [16];
  size_type local_290;
  allocator<char> local_281;
  string local_280 [32];
  server_slot *local_260;
  uint local_254;
  undefined1 local_250 [16];
  double local_240;
  long local_238;
  undefined4 local_230;
  allocator<char> local_229;
  string local_228 [32];
  size_t local_208;
  size_t local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  long local_1b8;
  allocator<char> local_1a9;
  string local_1a8 [32];
  server_slot *local_188;
  uint local_17c;
  undefined1 local_178 [16];
  double local_168;
  long local_160;
  size_t local_158;
  string local_150 [32];
  string local_130 [32];
  long local_110;
  size_type local_108;
  allocator<char> local_f9;
  string local_f8 [32];
  server_slot *local_d8;
  uint local_cc;
  undefined1 local_c8 [64];
  server_slot *local_88;
  server_slot *local_80;
  __normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_> local_78
  ;
  long local_70;
  int local_68;
  uint local_64;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_60 [2];
  reference local_40;
  server_slot *local_38;
  __normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_> local_30
  ;
  long local_28;
  server_slot *local_20;
  uint local_14;
  uint *local_10;
  
  iVar17 = (int)in_R8;
  local_10 = in_RSI;
  switch(in_RSI[2]) {
  case 0:
  case 1:
  case 2:
  case 3:
    local_14 = in_RSI[0x1ba];
    if (local_14 == 0xffffffff) {
      local_2c8 = get_available_slot(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    }
    else {
      local_2c8 = get_slot_by_id(in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
    }
    local_20 = local_2c8;
    if (local_2c8 == (server_slot *)0x0) {
      if (0 < common_log_verbosity_thold) {
        pcVar13 = common_log_main();
        common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,
                       "srv  %12.*s: no slot is available, defer task, id_task = %d\n",0xc,
                       "process_single_task",(ulong)*local_10);
      }
      server_queue::defer(in_stack_fffffffffffffb60,
                          (server_task *)
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    }
    else {
      bVar6 = server_slot::is_processing(local_2c8);
      if (bVar6) {
        if (0 < common_log_verbosity_thold) {
          pcVar13 = common_log_main();
          common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,
                         "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n",
                         0xc,"process_single_task",(ulong)*local_10);
        }
        server_queue::defer(in_stack_fffffffffffffb60,
                            (server_task *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      }
      else {
        bVar6 = launch_slot_with_task
                          (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                           in_stack_fffffffffffffcb8);
        if ((!bVar6) && (-1 < common_log_verbosity_thold)) {
          pcVar13 = common_log_main();
          common_log_add(pcVar13,GGML_LOG_LEVEL_ERROR,
                         "srv  %12.*s: failed to launch slot with task, id_task = %d\n",0xc,
                         "process_single_task",(ulong)*local_10);
        }
      }
    }
    break;
  case 4:
    local_28 = in_RDI + 0x1470;
    local_30._M_current =
         (server_slot *)
         httplib::detail::std::vector<server_slot,_std::allocator<server_slot>_>::begin
                   ((vector<server_slot,_std::allocator<server_slot>_> *)
                    CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_38 = (server_slot *)
               httplib::detail::std::vector<server_slot,_std::allocator<server_slot>_>::end
                         ((vector<server_slot,_std::allocator<server_slot>_> *)
                          CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    while (bVar6 = __gnu_cxx::operator!=
                             ((__normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                               *)in_stack_fffffffffffffb30,
                              (__normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)),
          bVar6) {
      local_40 = __gnu_cxx::
                 __normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                 ::operator*(&local_30);
      if (local_40->id_task == local_10[3]) {
        server_slot::release
                  ((server_slot *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        return;
      }
      __gnu_cxx::
      __normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>::
      operator++(&local_30);
    }
    break;
  case 5:
    break;
  case 6:
    httplib::detail::std::
    initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
    ::initializer_list(local_60);
    init._M_array._4_4_ = in_stack_fffffffffffffb44;
    init._M_array._0_4_ = in_stack_fffffffffffffb40;
    init._M_len = (size_type)in_stack_fffffffffffffb48;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    local_64 = 0;
    local_68 = 0;
    local_70 = in_RDI + 0x1470;
    local_78._M_current =
         (server_slot *)
         httplib::detail::std::vector<server_slot,_std::allocator<server_slot>_>::begin
                   ((vector<server_slot,_std::allocator<server_slot>_> *)
                    CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    local_80 = (server_slot *)
               httplib::detail::std::vector<server_slot,_std::allocator<server_slot>_>::end
                         ((vector<server_slot,_std::allocator<server_slot>_> *)
                          CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    while( true ) {
      bVar6 = __gnu_cxx::operator!=
                        ((__normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                          *)in_stack_fffffffffffffb30,
                         (__normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      iVar17 = (int)in_R8;
      if (!bVar6) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>
                 ::operator*(&local_78);
      server_slot::to_json_abi_cxx11_(in_stack_000005c8);
      bVar6 = server_slot::is_processing(local_88);
      if (bVar6) {
        local_68 = local_68 + 1;
      }
      else {
        local_64 = local_64 + 1;
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffb30);
      __gnu_cxx::
      __normal_iterator<server_slot_*,_std::vector<server_slot,_std::allocator<server_slot>_>_>::
      operator++(&local_78);
    }
    if (0 < common_log_verbosity_thold) {
      pcVar13 = common_log_main();
      iVar17 = 0x4458dd;
      common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: n_idle_slots = %d, n_processing_slots = %d\n",0xc,
                     "process_single_task",(ulong)local_64,local_68);
    }
    httplib::detail::std::make_unique<server_task_result_metrics>();
    uVar18 = *local_10;
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x295f31);
    (psVar8->super_server_task_result).id = uVar18;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    httplib::detail::std::
    unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>::
    operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                *)0x295f65);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffb30);
    uVar18 = local_64;
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x295fa1);
    iVar19 = local_68;
    psVar8->n_idle_slots = uVar18;
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x295fc6);
    psVar8->n_processing_slots = iVar19;
    sVar11 = httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::size
                       ((deque<server_task,_std::allocator<server_task>_> *)0x295fe4);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x295ff8);
    psVar8->n_tasks_deferred = (int)sVar11;
    iVar1 = *(int64_t *)(in_RDI + 0x1688);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296029);
    psVar8->t_start = iVar1;
    iVar7 = llama_kv_self_n_tokens(*(undefined8 *)(in_RDI + 0x13a0));
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296062);
    psVar8->kv_cache_tokens_count = iVar7;
    iVar7 = llama_kv_self_used_cells(*(undefined8 *)(in_RDI + 0x13a0));
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296099);
    psVar8->kv_cache_used_cells = iVar7;
    uVar16 = *(uint64_t *)(in_RDI + 0x1690);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x2960ca);
    psVar8->n_prompt_tokens_processed_total = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x1698);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x2960fd);
    psVar8->t_prompt_processing_total = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16a0);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296130);
    psVar8->n_tokens_predicted_total = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16a8);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296163);
    psVar8->t_tokens_generation_total = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16b0);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296196);
    psVar8->n_prompt_tokens_processed = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16b8);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x2961c9);
    psVar8->t_prompt_processing = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16c0);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x2961fc);
    psVar8->n_tokens_predicted = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16c8);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x29622f);
    psVar8->t_tokens_generation = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16d0);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296262);
    psVar8->n_decode_total = uVar16;
    uVar16 = *(uint64_t *)(in_RDI + 0x16d8);
    psVar8 = httplib::detail::std::
             unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
             ::operator->((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                           *)0x296295);
    psVar8->n_busy_slots_total = uVar16;
    if ((local_10[0x1ce] & 1) != 0) {
      server_metrics::reset_bucket((server_metrics *)(in_RDI + 0x1688));
    }
    std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
    unique_ptr<server_task_result_metrics,std::default_delete<server_task_result_metrics>,void>
              ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    server_response::send((server_response *)(in_RDI + 0x15d8),(int)local_c8,__buf,uVar16,iVar17);
    httplib::detail::std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::
    ~unique_ptr((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
                CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    httplib::detail::std::
    unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>::
    ~unique_ptr((unique_ptr<server_task_result_metrics,_std::default_delete<server_task_result_metrics>_>
                 *)in_stack_fffffffffffffb30);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffb30);
    break;
  case 7:
    local_cc = in_RSI[0x1bc];
    local_d8 = get_slot_by_id(in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
    if (local_d8 == (server_slot *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (allocator<char> *)in_stack_fffffffffffffb60);
      send_error((server_context *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (server_task *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
    }
    else {
      bVar6 = server_slot::is_processing(local_d8);
      if (bVar6) {
        if (0 < common_log_verbosity_thold) {
          pcVar13 = common_log_main();
          common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,
                         "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n",
                         0xc,"process_single_task",(ulong)*local_10);
        }
        server_queue::defer(in_stack_fffffffffffffb60,
                            (server_task *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      }
      else {
        local_108 = httplib::detail::std::vector<int,_std::allocator<int>_>::size
                              (&local_d8->cache_tokens);
        local_110 = ggml_time_us();
        std::__cxx11::string::string(local_130,(string *)(local_10 + 0x1be));
        std::__cxx11::string::string(local_150,(string *)(local_10 + 0x1c6));
        uVar2 = *(undefined8 *)(in_RDI + 0x13a0);
        uVar9 = std::__cxx11::string::c_str();
        iVar17 = local_d8->id;
        piVar10 = httplib::detail::std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)0x2965cb);
        sVar11 = local_108;
        local_158 = llama_state_seq_save_file(uVar2,uVar9,iVar17,piVar10);
        iVar17 = (int)sVar11;
        local_160 = ggml_time_us();
        local_168 = (double)(local_160 - local_110) / 1000.0;
        httplib::detail::std::make_unique<server_task_result_slot_save_load>();
        uVar18 = *local_10;
        psVar12 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                  ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                *)0x29668d);
        uVar5 = local_cc;
        (psVar12->super_server_task_result).id = uVar18;
        psVar12 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                  ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                *)0x2966b2);
        (psVar12->super_server_task_result).id_slot = uVar5;
        psVar12 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                  ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                *)0x2966c9);
        std::__cxx11::string::operator=((string *)&psVar12->filename,local_130);
        psVar12 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                  ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                *)0x2966f4);
        sVar11 = local_108;
        psVar12->is_save = true;
        psVar12 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                  ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                *)0x296715);
        sVar4 = local_158;
        psVar12->n_tokens = sVar11;
        psVar12 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                  ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                *)0x29673e);
        dVar3 = local_168;
        psVar12->n_bytes = sVar4;
        psVar12 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                  ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                *)0x296769);
        psVar12->t_ms = dVar3;
        std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
        unique_ptr<server_task_result_slot_save_load,std::default_delete<server_task_result_slot_save_load>,void>
                  ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        server_response::send
                  ((server_response *)(in_RDI + 0x15d8),(int)local_178,__buf_00,(size_t)psVar12,
                   iVar17);
        httplib::detail::std::
        unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::~unique_ptr
                  ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        httplib::detail::std::
        unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
        ::~unique_ptr((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                       *)in_stack_fffffffffffffb30);
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string(local_130);
      }
    }
    break;
  case 8:
    local_17c = in_RSI[0x1bc];
    local_188 = get_slot_by_id(in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
    if (local_188 == (server_slot *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (allocator<char> *)in_stack_fffffffffffffb60);
      send_error((server_context *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (server_task *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
    }
    else {
      bVar6 = server_slot::is_processing(local_188);
      if (bVar6) {
        if (0 < common_log_verbosity_thold) {
          pcVar13 = common_log_main();
          common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,
                         "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n",
                         0xc,"process_single_task",(ulong)*local_10);
        }
        server_queue::defer(in_stack_fffffffffffffb60,
                            (server_task *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      }
      else {
        local_1b8 = ggml_time_us();
        std::__cxx11::string::string(local_1d8,(string *)(local_10 + 0x1be));
        std::__cxx11::string::string(local_1f8,(string *)(local_10 + 0x1c6));
        httplib::detail::std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
        local_200 = 0;
        uVar2 = *(undefined8 *)(in_RDI + 0x13a0);
        uVar9 = std::__cxx11::string::c_str();
        iVar17 = local_188->id;
        piVar10 = httplib::detail::std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)0x296ace);
        sVar11 = httplib::detail::std::vector<int,_std::allocator<int>_>::size
                           (&local_188->cache_tokens);
        local_208 = llama_state_seq_load_file(uVar2,uVar9,iVar17,piVar10,sVar11,&local_200);
        iVar17 = (int)sVar11;
        if (local_208 == 0) {
          httplib::detail::std::vector<int,_std::allocator<int>_>::resize
                    (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                     (allocator<char> *)in_stack_fffffffffffffb60);
          send_error((server_context *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                     ,(server_task *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
          std::__cxx11::string::~string(local_228);
          std::allocator<char>::~allocator(&local_229);
          local_230 = 2;
        }
        else {
          httplib::detail::std::vector<int,_std::allocator<int>_>::resize
                    (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
          local_238 = ggml_time_us();
          local_240 = (double)(local_238 - local_1b8) / 1000.0;
          httplib::detail::std::make_unique<server_task_result_slot_save_load>();
          uVar18 = *local_10;
          psVar12 = httplib::detail::std::
                    unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                  *)0x296d04);
          uVar5 = local_17c;
          (psVar12->super_server_task_result).id = uVar18;
          psVar12 = httplib::detail::std::
                    unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                  *)0x296d29);
          (psVar12->super_server_task_result).id_slot = uVar5;
          psVar12 = httplib::detail::std::
                    unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                  *)0x296d40);
          std::__cxx11::string::operator=((string *)&psVar12->filename,local_1d8);
          psVar12 = httplib::detail::std::
                    unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                  *)0x296d6b);
          psVar12->is_save = false;
          sVar20 = local_200;
          psVar12 = httplib::detail::std::
                    unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                  *)0x296d89);
          sVar4 = local_208;
          psVar12->n_tokens = sVar20;
          psVar12 = httplib::detail::std::
                    unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                  *)0x296dac);
          dVar3 = local_240;
          psVar12->n_bytes = sVar4;
          psVar12 = httplib::detail::std::
                    unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                    ::operator->((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                                  *)0x296dd1);
          psVar12->t_ms = dVar3;
          psVar15 = (server_response *)(in_RDI + 0x15d8);
          std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
          unique_ptr<server_task_result_slot_save_load,std::default_delete<server_task_result_slot_save_load>,void>
                    ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                      *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          server_response::send(psVar15,(int)local_250,__buf_01,(size_t)psVar12,iVar17);
          httplib::detail::std::
          unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::~unique_ptr
                    ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
          httplib::detail::std::
          unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
          ::~unique_ptr((unique_ptr<server_task_result_slot_save_load,_std::default_delete<server_task_result_slot_save_load>_>
                         *)in_stack_fffffffffffffb30);
          local_230 = 0;
        }
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::string::~string(local_1d8);
      }
    }
    break;
  case 9:
    local_254 = in_RSI[0x1bc];
    local_260 = get_slot_by_id(in_stack_fffffffffffffb48,in_stack_fffffffffffffb44);
    if (local_260 == (server_slot *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                 (allocator<char> *)in_stack_fffffffffffffb60);
      send_error((server_context *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (server_task *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator(&local_281);
    }
    else {
      bVar6 = server_slot::is_processing(local_260);
      if (bVar6) {
        if (0 < common_log_verbosity_thold) {
          pcVar13 = common_log_main();
          common_log_add(pcVar13,GGML_LOG_LEVEL_DEBUG,
                         "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n",
                         0xc,"process_single_task",(ulong)*local_10);
        }
        server_queue::defer(in_stack_fffffffffffffb60,
                            (server_task *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      }
      else {
        local_290 = httplib::detail::std::vector<int,_std::allocator<int>_>::size
                              (&local_260->cache_tokens);
        llama_kv_self_seq_rm(*(undefined8 *)(in_RDI + 0x13a0),local_260->id,0xffffffff);
        httplib::detail::std::vector<int,_std::allocator<int>_>::clear
                  ((vector<int,_std::allocator<int>_> *)0x2970b4);
        httplib::detail::std::make_unique<server_task_result_slot_erase>();
        uVar18 = *local_10;
        psVar14 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                  ::operator->((unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                                *)0x2970de);
        (psVar14->super_server_task_result).id = uVar18;
        uVar18 = local_254;
        psVar14 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                  ::operator->((unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                                *)0x2970fa);
        (psVar14->super_server_task_result).id_slot = uVar18;
        sVar11 = local_290;
        psVar14 = httplib::detail::std::
                  unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                  ::operator->((unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                                *)0x297118);
        psVar14->n_erased = sVar11;
        psVar15 = (server_response *)(in_RDI + 0x15d8);
        std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
        unique_ptr<server_task_result_slot_erase,std::default_delete<server_task_result_slot_erase>,void>
                  ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                    *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        server_response::send(psVar15,(int)local_2a0,__buf_02,(size_t)psVar14,iVar17);
        httplib::detail::std::
        unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::~unique_ptr
                  ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)
                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        httplib::detail::std::
        unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
        ::~unique_ptr((unique_ptr<server_task_result_slot_erase,_std::default_delete<server_task_result_slot_erase>_>
                       *)in_stack_fffffffffffffb30);
      }
    }
    break;
  case 10:
    httplib::detail::std::
    vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::operator=
              ((vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    this_00 = &local_2a8;
    httplib::detail::std::make_unique<server_task_result_apply_lora>();
    uVar18 = *local_10;
    __n = httplib::detail::std::
          unique_ptr<server_task_result_apply_lora,_std::default_delete<server_task_result_apply_lora>_>
          ::operator->((unique_ptr<server_task_result_apply_lora,_std::default_delete<server_task_result_apply_lora>_>
                        *)0x2971fe);
    (__n->super_server_task_result).id = uVar18;
    psVar15 = (server_response *)(in_RDI + 0x15d8);
    iVar19 = (int)local_2b0;
    std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
    unique_ptr<server_task_result_apply_lora,std::default_delete<server_task_result_apply_lora>,void>
              (this_00,(unique_ptr<server_task_result_apply_lora,_std::default_delete<server_task_result_apply_lora>_>
                        *)CONCAT44(uVar18,in_stack_fffffffffffffb38));
    server_response::send(psVar15,iVar19,__buf_03,(size_t)__n,iVar17);
    httplib::detail::std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::
    ~unique_ptr(this_00);
    httplib::detail::std::
    unique_ptr<server_task_result_apply_lora,_std::default_delete<server_task_result_apply_lora>_>::
    ~unique_ptr((unique_ptr<server_task_result_apply_lora,_std::default_delete<server_task_result_apply_lora>_>
                 *)in_stack_fffffffffffffb30);
  }
  return;
}

Assistant:

void process_single_task(server_task && task) {
        switch (task.type) {
            case SERVER_TASK_TYPE_COMPLETION:
            case SERVER_TASK_TYPE_INFILL:
            case SERVER_TASK_TYPE_EMBEDDING:
            case SERVER_TASK_TYPE_RERANK:
                {
                    const int id_slot = task.id_selected_slot;

                    server_slot * slot = id_slot != -1 ? get_slot_by_id(id_slot) : get_available_slot(task);

                    if (slot == nullptr) {
                        // if no slot is available, we defer this task for processing later
                        SRV_DBG("no slot is available, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    if (!launch_slot_with_task(*slot, std::move(task))) {
                        SRV_ERR("failed to launch slot with task, id_task = %d\n", task.id);
                        break;
                    }
                } break;
            case SERVER_TASK_TYPE_CANCEL:
                {
                    // release slot linked with the task id
                    for (auto & slot : slots) {
                        if (slot.id_task == task.id_target) {
                            slot.release();
                            break;
                        }
                    }
                } break;
            case SERVER_TASK_TYPE_NEXT_RESPONSE:
                {
                    // do nothing
                } break;
            case SERVER_TASK_TYPE_METRICS:
                {
                    json slots_data = json::array();

                    int n_idle_slots       = 0;
                    int n_processing_slots = 0;

                    for (server_slot & slot : slots) {
                        json slot_data = slot.to_json();

                        if (slot.is_processing()) {
                            n_processing_slots++;
                        } else {
                            n_idle_slots++;
                        }

                        slots_data.push_back(slot_data);
                    }
                    SRV_DBG("n_idle_slots = %d, n_processing_slots = %d\n", n_idle_slots, n_processing_slots);

                    auto res = std::make_unique<server_task_result_metrics>();
                    res->id                  = task.id;
                    res->slots_data          = std::move(slots_data);
                    res->n_idle_slots        = n_idle_slots;
                    res->n_processing_slots  = n_processing_slots;
                    res->n_tasks_deferred    = queue_tasks.queue_tasks_deferred.size();
                    res->t_start             = metrics.t_start;

                    res->kv_cache_tokens_count = llama_kv_self_n_tokens(ctx);
                    res->kv_cache_used_cells   = llama_kv_self_used_cells(ctx);

                    res->n_prompt_tokens_processed_total = metrics.n_prompt_tokens_processed_total;
                    res->t_prompt_processing_total       = metrics.t_prompt_processing_total;
                    res->n_tokens_predicted_total        = metrics.n_tokens_predicted_total;
                    res->t_tokens_generation_total       = metrics.t_tokens_generation_total;

                    res->n_prompt_tokens_processed = metrics.n_prompt_tokens_processed;
                    res->t_prompt_processing       = metrics.t_prompt_processing;
                    res->n_tokens_predicted        = metrics.n_tokens_predicted;
                    res->t_tokens_generation       = metrics.t_tokens_generation;

                    res->n_decode_total          = metrics.n_decode_total;
                    res->n_busy_slots_total      = metrics.n_busy_slots_total;

                    if (task.metrics_reset_bucket) {
                        metrics.reset_bucket();
                    }
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_SAVE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const size_t token_count = slot->cache_tokens.size();
                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    const size_t nwrite = llama_state_seq_save_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_save_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = true;
                    res->n_tokens = token_count;
                    res->n_bytes  = nwrite;
                    res->t_ms     = t_save_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_RESTORE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    slot->cache_tokens.resize(slot->n_ctx);
                    size_t token_count = 0;
                    size_t nread = llama_state_seq_load_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), slot->cache_tokens.size(), &token_count);
                    if (nread == 0) {
                        slot->cache_tokens.resize(0);
                        send_error(task, "Unable to restore slot, no available space in KV cache or invalid slot save file", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    slot->cache_tokens.resize(token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_restore_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = false;
                    res->n_tokens = token_count;
                    res->n_bytes  = nread;
                    res->t_ms     = t_restore_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_ERASE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    // Erase token cache
                    const size_t n_erased = slot->cache_tokens.size();
                    llama_kv_self_seq_rm(ctx, slot->id, -1, -1);
                    slot->cache_tokens.clear();

                    auto res = std::make_unique<server_task_result_slot_erase>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->n_erased = n_erased;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SET_LORA:
                {
                    params_base.lora_adapters = std::move(task.set_lora);
                    auto res = std::make_unique<server_task_result_apply_lora>();
                    res->id = task.id;
                    queue_results.send(std::move(res));
                } break;
        }
    }